

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O1

endpoint __thiscall booster::aio::basic_socket::local_endpoint(basic_socket *this,error_code *e)

{
  error_category *peVar1;
  native_type __fd;
  int iVar2;
  sockaddr *__addr;
  int *piVar3;
  int *in_RDX;
  socklen_t len;
  socklen_t local_24;
  
  __addr = (sockaddr *)operator_new(1000);
  memset(__addr,0,1000);
  __fd = basic_io_device::native((basic_io_device *)e);
  iVar2 = getsockname(__fd,(sockaddr *)__addr,&local_24);
  if (iVar2 < 0) {
    piVar3 = __errno_location();
    peVar1 = syscat;
    *in_RDX = *piVar3;
    *(error_category **)(in_RDX + 2) = peVar1;
  }
  endpoint::endpoint((endpoint *)this);
  endpoint::raw((endpoint *)this,__addr,1000);
  operator_delete(__addr);
  return (endpoint)(copy_ptr<booster::aio::endpoint::data>)this;
}

Assistant:

endpoint basic_socket::local_endpoint(system::error_code &e)
{
	std::vector<char> endpoint_raw_(1000,0);
	sockaddr *sa = reinterpret_cast<sockaddr *>(&endpoint_raw_.front());
	socklen_t len = endpoint_raw_.size();
	if(::getsockname(native(),sa,&len) < 0)
		e=geterror();
	endpoint ep;
	ep.raw(sa,len);
	return ep;
}